

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotobasedialog.h
# Opt level: O3

void __thiscall Ui_GoToBaseDialog::setupUi(Ui_GoToBaseDialog *this,QDialog *GoToBaseDialog)

{
  QVBoxLayout *pQVar1;
  QGroupBox *this_00;
  QHBoxLayout *pQVar2;
  QLabel *pQVar3;
  HexSpinBox *this_01;
  QDialogButtonBox *pQVar4;
  undefined4 *puVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayData *local_68;
  undefined8 local_60;
  long local_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QSlotObjectBase local_40;
  
  QObject::objectName();
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  if (local_58 == 0) {
    QVar12.m_data = (storage_type *)0xe;
    QVar12.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar12);
    QObject::setObjectName((QString *)GoToBaseDialog);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,8);
      }
    }
  }
  local_68 = (QArrayData *)&DAT_560000010e;
  QWidget::resize((QSize *)GoToBaseDialog);
  QDialog::setModal(SUB81(GoToBaseDialog,0));
  pQVar1 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar1,(QWidget *)GoToBaseDialog);
  this->verticalLayout = pQVar1;
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,5);
  pQVar1 = this->verticalLayout;
  QVar6.m_data = (storage_type *)0xe;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar1);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QLayout::setContentsMargins((int)this->verticalLayout,5,5,5);
  this_00 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(this_00,(QWidget *)GoToBaseDialog);
  this->groupBox = this_00;
  QVar7.m_data = (storage_type *)0x8;
  QVar7.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_00);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  pQVar2 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar2,(QWidget *)this->groupBox);
  this->horizontalLayout = pQVar2;
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,5);
  pQVar2 = this->horizontalLayout;
  QVar8.m_data = (storage_type *)0x10;
  QVar8.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar2);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QLayout::setContentsMargins((int)this->horizontalLayout,5,5,5);
  pQVar3 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar3,this->groupBox,0);
  this->label = pQVar3;
  QVar9.m_data = (storage_type *)0x5;
  QVar9.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QBoxLayout::addWidget(this->horizontalLayout,this->label,0,0);
  this_01 = (HexSpinBox *)operator_new(0x38);
  HexSpinBox::HexSpinBox(this_01,(QWidget *)this->groupBox);
  this->hexSpinBox = this_01;
  QVar10.m_data = (storage_type *)0xa;
  QVar10.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)this_01);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->hexSpinBox,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->hexSpinBox,0,0);
  QBoxLayout::addWidget(this->verticalLayout,this->groupBox,0,0);
  pQVar4 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar4,(QWidget *)GoToBaseDialog);
  this->buttonBox = pQVar4;
  QVar11.m_data = (storage_type *)0x9;
  QVar11.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar4);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  QDialogButtonBox::setStandardButtons(this->buttonBox,0x400400);
  QBoxLayout::addWidget(this->verticalLayout,this->buttonBox,0,0);
  retranslateUi(this,GoToBaseDialog);
  pQVar4 = this->buttonBox;
  local_68 = (QArrayData *)QDialogButtonBox::accepted;
  local_60 = 0;
  local_40.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1b9;
  local_40._4_4_ = 0;
  local_40.m_impl = (ImplFn)0x0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar5 + 4) = 0x1b9;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar4,(QObject *)&local_68,(void **)GoToBaseDialog,&local_40,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar4 = this->buttonBox;
  local_68 = (QArrayData *)QDialogButtonBox::rejected;
  local_60 = 0;
  local_40.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c1;
  local_40._4_4_ = 0;
  local_40.m_impl = (ImplFn)0x0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar5 + 4) = 0x1c1;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar4,(QObject *)&local_68,(void **)GoToBaseDialog,&local_40,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QMetaObject::connectSlotsByName((QObject *)GoToBaseDialog);
  return;
}

Assistant:

void setupUi(QDialog *GoToBaseDialog)
    {
        if (GoToBaseDialog->objectName().isEmpty())
            GoToBaseDialog->setObjectName(QString::fromUtf8("GoToBaseDialog"));
        GoToBaseDialog->resize(270, 86);
        GoToBaseDialog->setModal(false);
        verticalLayout = new QVBoxLayout(GoToBaseDialog);
        verticalLayout->setSpacing(5);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        verticalLayout->setContentsMargins(5, 5, 5, 5);
        groupBox = new QGroupBox(GoToBaseDialog);
        groupBox->setObjectName(QString::fromUtf8("groupBox"));
        horizontalLayout = new QHBoxLayout(groupBox);
        horizontalLayout->setSpacing(5);
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        horizontalLayout->setContentsMargins(5, 5, 5, 5);
        label = new QLabel(groupBox);
        label->setObjectName(QString::fromUtf8("label"));

        horizontalLayout->addWidget(label);

        hexSpinBox = new HexSpinBox(groupBox);
        hexSpinBox->setObjectName(QString::fromUtf8("hexSpinBox"));
        QSizePolicy sizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(hexSpinBox->sizePolicy().hasHeightForWidth());
        hexSpinBox->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(hexSpinBox);


        verticalLayout->addWidget(groupBox);

        buttonBox = new QDialogButtonBox(GoToBaseDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        verticalLayout->addWidget(buttonBox);


        retranslateUi(GoToBaseDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, GoToBaseDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, GoToBaseDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(GoToBaseDialog);
    }